

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O1

void embed_prepare_cb(ev_loop *loop,ev_prepare *prepare,int revents)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  ev_loop *loop_00;
  ANFD *pAVar4;
  WL peVar5;
  byte bVar6;
  long lVar7;
  
  loop_00 = *(ev_loop **)&prepare[-2].priority;
  iVar3 = loop_00->fdchangecnt;
  while (iVar3 != 0) {
    if (0 < iVar3) {
      lVar7 = 0;
      do {
        pAVar4 = loop_00->anfds;
        iVar3 = loop_00->fdchanges[lVar7];
        bVar1 = pAVar4[iVar3].events;
        uVar2 = pAVar4[iVar3].reify;
        pAVar4[iVar3].reify = '\0';
        pAVar4[iVar3].events = '\0';
        peVar5 = pAVar4[iVar3].head;
        if (peVar5 != (WL)0x0) {
          bVar6 = 0;
          do {
            bVar6 = bVar6 | (byte)peVar5[1].pending;
            peVar5 = peVar5->next;
          } while (peVar5 != (ev_watcher_list *)0x0);
          pAVar4[iVar3].events = bVar6;
        }
        if ((bVar1 != pAVar4[iVar3].events) || ((char)uVar2 < '\0')) {
          (*loop_00->backend_modify)(loop_00,iVar3,(uint)bVar1,(uint)pAVar4[iVar3].events);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < loop_00->fdchangecnt);
    }
    loop_00->fdchangecnt = 0;
    ev_run(loop_00,1);
    iVar3 = loop_00->fdchangecnt;
  }
  return;
}

Assistant:

static void
embed_prepare_cb (EV_P_ ev_prepare *prepare, int revents)
{
  ev_embed *w = (ev_embed *)(((char *)prepare) - offsetof (ev_embed, prepare));

  {
    EV_P = w->other;

    while (fdchangecnt)
      {
        fd_reify (EV_A);
        ev_run (EV_A_ EVRUN_NOWAIT);
      }
  }
}